

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t HUF_decompress1X1_usingDTable_internal_bmi2
                 (void *dst,size_t dstSize,void *cSrc,size_t cSrcSize,HUF_DTable *DTable)

{
  undefined1 *puVar1;
  byte bVar2;
  ushort uVar3;
  char cVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  void *pvVar12;
  bool bVar13;
  
  if (cSrcSize == 0) {
    return 0xffffffffffffffb8;
  }
  uVar3 = *(ushort *)((long)DTable + 2);
  if (cSrcSize < 8) {
    uVar7 = (ulong)*cSrc;
    switch(cSrcSize) {
    case 7:
      uVar7 = uVar7 | (ulong)*(byte *)((long)cSrc + 6) << 0x30;
    case 6:
      uVar7 = uVar7 + ((ulong)*(byte *)((long)cSrc + 5) << 0x28);
    case 5:
      uVar7 = uVar7 + ((ulong)*(byte *)((long)cSrc + 4) << 0x20);
    case 4:
      uVar7 = uVar7 + (ulong)*(byte *)((long)cSrc + 3) * 0x1000000;
    case 3:
      uVar7 = uVar7 + (ulong)*(byte *)((long)cSrc + 2) * 0x10000;
    case 2:
      uVar7 = uVar7 + (ulong)*(byte *)((long)cSrc + 1) * 0x100;
    }
    bVar2 = *(byte *)((long)cSrc + (cSrcSize - 1));
    if (bVar2 == 0) {
      return 0xffffffffffffffec;
    }
    uVar8 = 0x1f;
    if (bVar2 != 0) {
      for (; bVar2 >> uVar8 == 0; uVar8 = uVar8 - 1) {
      }
    }
    uVar8 = (uVar8 ^ 0x1f) + (int)cSrcSize * -8 + 0x29;
    lVar6 = 0;
  }
  else {
    bVar2 = *(byte *)((long)cSrc + (cSrcSize - 1));
    if (bVar2 == 0) {
      return 0xffffffffffffffff;
    }
    if (0xffffffffffffff88 < cSrcSize) {
      return cSrcSize;
    }
    uVar7 = *(ulong *)((long)cSrc + (cSrcSize - 8));
    lVar6 = cSrcSize - 8;
    uVar8 = 0x1f;
    if (bVar2 != 0) {
      for (; bVar2 >> uVar8 == 0; uVar8 = uVar8 - 1) {
      }
    }
    uVar8 = ~uVar8 + 9;
  }
  uVar11 = (ulong)uVar8;
  puVar1 = (undefined1 *)((long)dst + dstSize);
  pvVar12 = (void *)((long)cSrc + lVar6);
  uVar8 = -(uint)uVar3 & 0x3f;
  do {
    cVar4 = (char)uVar3;
    if (lVar6 < 8) {
      if (lVar6 == 0) {
LAB_001721a5:
        if (dst < puVar1) {
          if (cVar4 == '\0') {
LAB_0017220e:
            __assert_fail("nbBits >= 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x680,"size_t BIT_lookBitsFast(const BIT_DStream_t *, U32)");
          }
          do {
            uVar10 = (uVar7 << (uVar11 & 0x3f)) >> uVar8;
            uVar5 = (uint)*(byte *)((long)DTable + uVar10 * 2 + 5) + (int)uVar11;
            *(undefined1 *)dst = *(undefined1 *)((long)DTable + uVar10 * 2 + 4);
            dst = (void *)((long)dst + 1);
            uVar11 = (ulong)uVar5;
          } while (dst < puVar1);
        }
        else {
          uVar5 = (uint)uVar11;
        }
        if (uVar5 != 0x40) {
          dstSize = 0xffffffffffffffec;
        }
        if (pvVar12 != cSrc) {
          dstSize = 0xffffffffffffffec;
        }
        return dstSize;
      }
      uVar5 = (uint)(uVar11 >> 3);
      bVar13 = cSrc <= (void *)((long)pvVar12 - (uVar11 >> 3));
      if (!bVar13) {
        uVar5 = (uint)lVar6;
      }
      uVar9 = (uint)uVar11 + uVar5 * -8;
    }
    else {
      uVar5 = (uint)(uVar11 >> 3);
      uVar9 = (uint)uVar11 & 7;
      bVar13 = true;
    }
    uVar11 = (ulong)uVar9;
    lVar6 = lVar6 - (ulong)uVar5;
    pvVar12 = (void *)((long)cSrc + lVar6);
    uVar7 = *(ulong *)((long)cSrc + lVar6);
    if ((puVar1 + -3 <= dst) || (!bVar13)) goto LAB_001721a5;
    if (cVar4 == '\0') goto LAB_0017220e;
    uVar11 = (uVar7 << (uVar11 & 0x3f)) >> uVar8;
    uVar9 = *(byte *)((long)DTable + uVar11 * 2 + 5) + uVar9;
    *(undefined1 *)dst = *(undefined1 *)((long)DTable + uVar11 * 2 + 4);
    uVar11 = (uVar7 << ((ulong)uVar9 & 0x3f)) >> uVar8;
    uVar9 = *(byte *)((long)DTable + uVar11 * 2 + 5) + uVar9;
    *(undefined1 *)((long)dst + 1) = *(undefined1 *)((long)DTable + uVar11 * 2 + 4);
    uVar11 = (uVar7 << ((ulong)uVar9 & 0x3f)) >> uVar8;
    uVar9 = *(byte *)((long)DTable + uVar11 * 2 + 5) + uVar9;
    *(undefined1 *)((long)dst + 2) = *(undefined1 *)((long)DTable + uVar11 * 2 + 4);
    uVar10 = (uVar7 << ((ulong)uVar9 & 0x3f)) >> uVar8;
    uVar9 = *(byte *)((long)DTable + uVar10 * 2 + 5) + uVar9;
    uVar11 = (ulong)uVar9;
    *(undefined1 *)((long)dst + 3) = *(undefined1 *)((long)DTable + uVar10 * 2 + 4);
    dst = (void *)((long)dst + 4);
    if (0x40 < uVar9) goto LAB_001721a5;
  } while( true );
}

Assistant:

MEM_STATIC size_t BIT_initDStream(BIT_DStream_t* bitD, const void* srcBuffer, size_t srcSize)
{
    if (srcSize < 1) { memset(bitD, 0, sizeof(*bitD)); return ERROR(srcSize_wrong); }

    bitD->start = (const char*)srcBuffer;
    bitD->limitPtr = bitD->start + sizeof(bitD->bitContainer);

    if (srcSize >=  sizeof(bitD->bitContainer)) {  /* normal case */
        bitD->ptr   = (const char*)srcBuffer + srcSize - sizeof(bitD->bitContainer);
        bitD->bitContainer = MEM_readLEST(bitD->ptr);
        { BYTE const lastByte = ((const BYTE*)srcBuffer)[srcSize-1];
          bitD->bitsConsumed = lastByte ? 8 - BIT_highbit32(lastByte) : 0;  /* ensures bitsConsumed is always set */
          if (lastByte == 0) return ERROR(GENERIC); /* endMark not present */ }
    } else {
        bitD->ptr   = bitD->start;
        bitD->bitContainer = *(const BYTE*)(bitD->start);
        switch(srcSize)
        {
        case 7: bitD->bitContainer += (size_t)(((const BYTE*)(srcBuffer))[6]) << (sizeof(bitD->bitContainer)*8 - 16);
                /* fall-through */

        case 6: bitD->bitContainer += (size_t)(((const BYTE*)(srcBuffer))[5]) << (sizeof(bitD->bitContainer)*8 - 24);
                /* fall-through */

        case 5: bitD->bitContainer += (size_t)(((const BYTE*)(srcBuffer))[4]) << (sizeof(bitD->bitContainer)*8 - 32);
                /* fall-through */

        case 4: bitD->bitContainer += (size_t)(((const BYTE*)(srcBuffer))[3]) << 24;
                /* fall-through */

        case 3: bitD->bitContainer += (size_t)(((const BYTE*)(srcBuffer))[2]) << 16;
                /* fall-through */

        case 2: bitD->bitContainer += (size_t)(((const BYTE*)(srcBuffer))[1]) <<  8;
                /* fall-through */

        default: break;
        }
        {   BYTE const lastByte = ((const BYTE*)srcBuffer)[srcSize-1];
            bitD->bitsConsumed = lastByte ? 8 - BIT_highbit32(lastByte) : 0;
            if (lastByte == 0) return ERROR(corruption_detected);  /* endMark not present */
        }
        bitD->bitsConsumed += (U32)(sizeof(bitD->bitContainer) - srcSize)*8;
    }

    return srcSize;
}